

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O0

void SUNDlsMat_bandGBTRS(sunrealtype **a,sunindextype n,sunindextype smu,sunindextype ml,
                        sunindextype *p,sunrealtype *b)

{
  double dVar1;
  long lVar2;
  sunrealtype *psVar3;
  long local_78;
  long local_70;
  sunrealtype *diag_k;
  sunrealtype mult;
  sunindextype last_row_k;
  sunindextype first_row_k;
  sunindextype i;
  sunindextype l;
  sunindextype k;
  sunrealtype *b_local;
  sunindextype *p_local;
  sunindextype ml_local;
  sunindextype smu_local;
  sunindextype n_local;
  sunrealtype **a_local;
  
  for (k = 0; k < n + -1; k = k + 1) {
    lVar2 = p[k];
    dVar1 = b[lVar2];
    if (lVar2 != k) {
      b[lVar2] = b[k];
      b[k] = dVar1;
    }
    psVar3 = a[k];
    i = k;
    if (n + -1 < k + ml) {
      local_70 = n + -1;
    }
    else {
      local_70 = k + ml;
    }
    while (i = i + 1, i <= local_70) {
      b[i] = dVar1 * psVar3[smu + (i - k)] + b[i];
    }
  }
  for (k = n + -1; -1 < k; k = k + -1) {
    psVar3 = a[k];
    if (k - smu < 0) {
      local_78 = 0;
    }
    else {
      local_78 = k - smu;
    }
    b[k] = b[k] / psVar3[smu];
    dVar1 = b[k];
    for (i = local_78; i <= k + -1; i = i + 1) {
      b[i] = -dVar1 * (psVar3 + smu)[i - k] + b[i];
    }
  }
  return;
}

Assistant:

void SUNDlsMat_bandGBTRS(sunrealtype** a, sunindextype n, sunindextype smu,
                         sunindextype ml, sunindextype* p, sunrealtype* b)
{
  sunindextype k, l, i, first_row_k, last_row_k;
  sunrealtype mult, *diag_k;

  /* Solve Ly = Pb, store solution y in b */

  for (k = 0; k < n - 1; k++)
  {
    l    = p[k];
    mult = b[l];
    if (l != k)
    {
      b[l] = b[k];
      b[k] = mult;
    }
    diag_k     = a[k] + smu;
    last_row_k = SUNMIN(n - 1, k + ml);
    for (i = k + 1; i <= last_row_k; i++) { b[i] += mult * diag_k[i - k]; }
  }

  /* Solve Ux = y, store solution x in b */

  for (k = n - 1; k >= 0; k--)
  {
    diag_k      = a[k] + smu;
    first_row_k = SUNMAX(0, k - smu);
    b[k] /= (*diag_k);
    mult = -b[k];
    for (i = first_row_k; i <= k - 1; i++) { b[i] += mult * diag_k[i - k]; }
  }
}